

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::dragMoveEvent(QListView *this,QDragMoveEvent *e)

{
  long lVar1;
  long lVar2;
  char cVar3;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  cVar3 = (**(code **)(**(long **)(lVar1 + 0x540) + 0xa8))();
  if (cVar3 != '\0') {
    return;
  }
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if ((*(int *)(lVar2 + 0x568) == 0) && (*(int *)(lVar2 + 0x558) == 0)) {
    QListModeViewBase::dragMoveEvent(*(QListModeViewBase **)(lVar1 + 0x540),e);
    return;
  }
  QAbstractItemView::dragMoveEvent((QAbstractItemView *)this,e);
  return;
}

Assistant:

void QListView::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QListView);
    if (!d->commonListView->filterDragMoveEvent(e)) {
        if (viewMode() == QListView::ListMode && flow() == QListView::LeftToRight)
            static_cast<QListModeViewBase *>(d->commonListView)->dragMoveEvent(e);
        else
            QAbstractItemView::dragMoveEvent(e);
    }
}